

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

u8 * pageFindSlot(MemPage *pPg,int nByte,int *pRc)

{
  u32 uVar1;
  u8 *puVar2;
  ulong uVar3;
  undefined8 uVar4;
  ulong uVar5;
  uint uVar6;
  ushort uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  
  uVar3 = (ulong)pPg->hdrOffset;
  puVar2 = pPg->aData;
  uVar7 = *(ushort *)(puVar2 + uVar3 + 1) << 8 | *(ushort *)(puVar2 + uVar3 + 1) >> 8;
  uVar1 = pPg->pBt->usableSize;
  uVar5 = uVar3 + 1;
  while( true ) {
    uVar10 = (ulong)uVar7;
    uVar8 = (uint)uVar7;
    if (((int)(uVar1 - 4) < (int)uVar8) || (uVar8 < (int)uVar5 + 4U)) break;
    uVar6 = (uint)(ushort)(*(ushort *)(puVar2 + uVar10 + 2) << 8 |
                          *(ushort *)(puVar2 + uVar10 + 2) >> 8);
    uVar9 = uVar6 - nByte;
    if (-1 < (int)uVar9) {
      if (((uint)pPg->cellOffset + (uint)pPg->nCell * 2 <= uVar8) &&
         ((int)(uVar6 + uVar8) <= (int)uVar1)) {
        if (uVar9 < 4) {
          if (0x39 < puVar2[uVar3 + 7]) {
            return (u8 *)0x0;
          }
          *(undefined2 *)(puVar2 + uVar5) = *(undefined2 *)(puVar2 + uVar10);
          puVar2[uVar3 + 7] = puVar2[uVar3 + 7] + (char)uVar9;
        }
        else {
          *(ushort *)(puVar2 + uVar10 + 2) = (ushort)uVar9 << 8 | (ushort)uVar9 >> 8;
        }
        return puVar2 + (uVar9 + uVar8);
      }
      uVar4 = 0xee82;
      goto LAB_00142af2;
    }
    uVar7 = *(ushort *)(puVar2 + uVar10) << 8 | *(ushort *)(puVar2 + uVar10) >> 8;
    uVar5 = uVar10;
    if (uVar7 == 0) {
      return (u8 *)0x0;
    }
  }
  uVar4 = 0xee77;
LAB_00142af2:
  sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar4,
              "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34");
  *pRc = 0xb;
  return (u8 *)0x0;
}

Assistant:

static u8 *pageFindSlot(MemPage *pPg, int nByte, int *pRc){
  const int hdr = pPg->hdrOffset;
  u8 * const aData = pPg->aData;
  int iAddr = hdr + 1;
  int pc = get2byte(&aData[iAddr]);
  int x;
  int usableSize = pPg->pBt->usableSize;

  assert( pc>0 );
  do{
    int size;            /* Size of the free slot */
    /* EVIDENCE-OF: R-06866-39125 Freeblocks are always connected in order of
    ** increasing offset. */
    if( pc>usableSize-4 || pc<iAddr+4 ){
      *pRc = SQLITE_CORRUPT_PGNO(pPg->pgno);
      return 0;
    }
    /* EVIDENCE-OF: R-22710-53328 The third and fourth bytes of each
    ** freeblock form a big-endian integer which is the size of the freeblock
    ** in bytes, including the 4-byte header. */
    size = get2byte(&aData[pc+2]);
    if( (x = size - nByte)>=0 ){
      testcase( x==4 );
      testcase( x==3 );
      if( pc < pPg->cellOffset+2*pPg->nCell || size+pc > usableSize ){
        *pRc = SQLITE_CORRUPT_PGNO(pPg->pgno);
        return 0;
      }else if( x<4 ){
        /* EVIDENCE-OF: R-11498-58022 In a well-formed b-tree page, the total
        ** number of bytes in fragments may not exceed 60. */
        if( aData[hdr+7]>57 ) return 0;

        /* Remove the slot from the free-list. Update the number of
        ** fragmented bytes within the page. */
        memcpy(&aData[iAddr], &aData[pc], 2);
        aData[hdr+7] += (u8)x;
      }else{
        /* The slot remains on the free-list. Reduce its size to account
         ** for the portion used by the new allocation. */
        put2byte(&aData[pc+2], x);
      }
      return &aData[pc + x];
    }
    iAddr = pc;
    pc = get2byte(&aData[pc]);
  }while( pc );

  return 0;
}